

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drive_circle.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  _Setprecision _Var2;
  ostream *poVar3;
  char *pcVar4;
  bool local_251;
  undefined1 local_240 [8];
  Pose pose;
  float local_210 [2];
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  Create local_1e8 [8];
  Create robot;
  allocator local_91;
  string local_90 [32];
  undefined4 local_70;
  int baud;
  allocator local_59;
  string local_58 [8];
  string port;
  undefined8 uStack_38;
  RobotModel model;
  undefined8 local_28;
  char **argv_local;
  int argc_local;
  
  local_28 = _operator<<;
  uStack_38 = create::RobotModel::CREATE_2;
  _model = _Init;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"/dev/ttyUSB0",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_70 = 0x1c200;
  local_251 = false;
  if (1 < argc) {
    pcVar4 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar4,&local_91);
    local_251 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"create1");
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  if (local_251 == false) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Running driver for Create 2");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_28 = _operator_new;
    uStack_38 = create::RobotModel::CREATE_1;
    _model = _operator<<;
    local_70 = 0xe100;
    poVar3 = std::operator<<((ostream *)&std::cout,"Running driver for Create 1");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  local_1f8 = local_28;
  local_208 = uStack_38;
  uStack_200 = _model;
  create::Create::Create(local_1e8,1);
  bVar1 = create::Create::connect((string *)local_1e8,(int *)local_58);
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Failed to connect to robot on port ");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    create::Create::~Create(local_1e8);
    std::__cxx11::string::~string(local_58);
    return 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Connected to robot");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_210[1] = 4.2039e-45;
  create::Create::setMode((CreateMode *)local_1e8);
  usleep(100000);
  local_210[0] = 0.2;
  pose._36_4_ = 0x3e19999a;
  create::Create::driveRadius((float *)local_1e8,local_210);
  do {
    create::Create::getPose();
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
    _Var2 = std::setprecision(2);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = std::operator<<(poVar3,"\rOdometry (x, y, yaw): (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)local_240._0_4_);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)local_240._4_4_);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pose.x);
    std::operator<<(poVar3,")      ");
    usleep(10000);
    create::Pose::~Pose((Pose *)local_240);
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  // Select robot. Assume Create 2 unless argument says otherwise
  create::RobotModel model = create::RobotModel::CREATE_2;
  std::string port = "/dev/ttyUSB0";
  int baud = 115200;
  if (argc > 1 && std::string(argv[1]) == "create1") {
    model = create::RobotModel::CREATE_1;
    baud = 57600;
    std::cout << "Running driver for Create 1" << std::endl;
  }
  else {
    std::cout << "Running driver for Create 2" << std::endl;
  }

  // Construct robot object
  create::Create robot(model);

  // Connect to robot
  if (robot.connect(port, baud))
    std::cout << "Connected to robot" << std::endl;
  else {
    std::cout << "Failed to connect to robot on port " << port.c_str() << std::endl;
    return 1;
  }

  // Switch to Full mode
  robot.setMode(create::MODE_FULL);

  // There's a delay between switching modes and when the robot will accept drive commands
  usleep(100000);

  // Command robot to drive a radius of 0.15 metres at 0.2 m/s
  robot.driveRadius(0.2, 0.15);

  while (true) {
    // Get robot odometry and print
    const create::Pose pose = robot.getPose();

    std::cout << std::fixed << std::setprecision(2) << "\rOdometry (x, y, yaw): ("
              << pose.x << ", " << pose.y << ", " << pose.yaw << ")      ";

    usleep(10000);  // 10 Hz
  }

  return 0;
}